

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::GuildMember::GuildMember(GuildMember *this,GuildMember *param_1)

{
  omittable_field<discordpp::User>::omittable_field(&this->user,&param_1->user);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->nick,&param_1->nick);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->avatar,&param_1->avatar);
  field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>::field
            (&this->roles,&param_1->roles);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->joined_at,&param_1->joined_at);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->premium_since,&param_1->premium_since);
  field<bool>::field(&this->deaf,&param_1->deaf);
  field<bool>::field(&this->mute,&param_1->mute);
  field<int>::field(&this->flags,&param_1->flags);
  omittable_field<bool>::omittable_field(&this->pending,&param_1->pending);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->permissions,&param_1->permissions);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field
            (&this->communication_disabled_until,&param_1->communication_disabled_until);
  return;
}

Assistant:

GuildMember(
        omittable_field<User> user = omitted,
        nullable_omittable_field<std::string> nick = omitted,
        nullable_omittable_field<std::string> avatar = omitted,
        field<std::vector<Snowflake> > roles = uninitialized,
        field<Timestamp> joined_at = uninitialized,
        nullable_omittable_field<Timestamp> premium_since = omitted,
        field<bool> deaf = uninitialized,
        field<bool> mute = uninitialized,
        field<int> flags = uninitialized,
        omittable_field<bool> pending = omitted,
        omittable_field<std::string> permissions = omitted,
        nullable_omittable_field<Timestamp> communication_disabled_until = omitted
    ):
        user(user),
        nick(nick),
        avatar(avatar),
        roles(roles),
        joined_at(joined_at),
        premium_since(premium_since),
        deaf(deaf),
        mute(mute),
        flags(flags),
        pending(pending),
        permissions(permissions),
        communication_disabled_until(communication_disabled_until)
    {}